

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::Struct::IsSameImpl(Struct *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppTVar5;
  size_type sVar6;
  mapped_type *__x;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  long lVar4;
  
  iVar3 = (*that->_vptr_Type[0x1c])(that);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if ((((lVar4 == 0) ||
       ((long)(this->element_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->element_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        *(long *)(lVar4 + 0x30) - *(long *)(lVar4 + 0x28))) ||
      ((this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
       *(size_t *)(lVar4 + 0x68))) ||
     (bVar1 = Type::HasSameDecorations(&this->super_Type,that), !bVar1)) {
LAB_001ae856:
    bVar1 = false;
  }
  else {
    ppTVar5 = (this->element_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->element_types_).
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
      uVar9 = 0;
      do {
        iVar3 = (*ppTVar5[uVar9]->_vptr_Type[2])
                          (ppTVar5[uVar9],*(undefined8 *)(*(long *)(lVar4 + 0x28) + uVar9 * 8),seen)
        ;
        if ((char)iVar3 == '\0') goto LAB_001ae856;
        uVar9 = uVar9 + 1;
        ppTVar5 = (this->element_types_).
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(this->element_types_).
                                     super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3
                              ));
    }
    p_Var7 = (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(this->element_decorations_)._M_t._M_impl.super__Rb_tree_header;
    bVar1 = (_Rb_tree_header *)p_Var7 == p_Var8;
    if (!bVar1) {
      do {
        sVar6 = std::
                map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                ::count((map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                         *)(lVar4 + 0x40),&p_Var7[1]._M_color);
        if (sVar6 == 0) {
          return bVar1;
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector(&local_60,
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&p_Var7[1]._M_parent);
        __x = std::
              map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
              ::at((map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                    *)(lVar4 + 0x40),&p_Var7[1]._M_color);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector(&local_48,__x);
        bVar2 = anon_unknown_29::CompareTwoVectors(&local_60,&local_48);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_48);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_60);
        if (!bVar2) {
          return bVar1;
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        bVar1 = (_Rb_tree_header *)p_Var7 == p_Var8;
      } while (!bVar1);
    }
  }
  return bVar1;
}

Assistant:

bool Struct::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Struct* st = that->AsStruct();
  if (!st) return false;
  if (element_types_.size() != st->element_types_.size()) return false;
  const auto size = element_decorations_.size();
  if (size != st->element_decorations_.size()) return false;
  if (!HasSameDecorations(that)) return false;

  for (size_t i = 0; i < element_types_.size(); ++i) {
    if (!element_types_[i]->IsSameImpl(st->element_types_[i], seen))
      return false;
  }
  for (const auto& p : element_decorations_) {
    if (st->element_decorations_.count(p.first) == 0) return false;
    if (!CompareTwoVectors(p.second, st->element_decorations_.at(p.first)))
      return false;
  }
  return true;
}